

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O0

void dequant_comp(j_decompress_ptr cinfo,jpeg_component_info *compptr,jvirt_barray_ptr coef_array,
                 JQUANT_TBL *qtblptr1)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  long in_RDI;
  JCOEFPTR ptr;
  JBLOCKROW block;
  JBLOCKARRAY buffer;
  JQUANT_TBL *qtblptr;
  int k;
  int offset_y;
  JDIMENSION blk_y;
  JDIMENSION blk_x;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  
  lVar1 = *(long *)(in_RSI + 0x50);
  for (local_28 = 0; local_28 < *(uint *)(in_RSI + 0x20);
      local_28 = *(int *)(in_RSI + 0xc) + local_28) {
    lVar3 = (**(code **)(*(long *)(in_RDI + 8) + 0x40))
                      (in_RDI,in_RDX,local_28,*(undefined4 *)(in_RSI + 0xc),1);
    for (local_2c = 0; local_2c < *(int *)(in_RSI + 0xc); local_2c = local_2c + 1) {
      lVar2 = *(long *)(lVar3 + (long)local_2c * 8);
      for (local_24 = 0; local_24 < *(uint *)(in_RSI + 0x1c); local_24 = local_24 + 1) {
        lVar4 = lVar2 + (ulong)local_24 * 0x80;
        for (local_30 = 0; local_30 < 0x40; local_30 = local_30 + 1) {
          if (*(short *)(lVar1 + (long)local_30 * 2) != *(short *)(in_RCX + (long)local_30 * 2)) {
            *(short *)(lVar4 + (long)local_30 * 2) =
                 *(short *)(lVar4 + (long)local_30 * 2) *
                 (short)((ulong)*(ushort *)(lVar1 + (long)local_30 * 2) /
                        (ulong)(long)(int)(uint)*(ushort *)(in_RCX + (long)local_30 * 2));
          }
        }
      }
    }
  }
  return;
}

Assistant:

LOCAL(void)
dequant_comp(j_decompress_ptr cinfo, jpeg_component_info *compptr,
             jvirt_barray_ptr coef_array, JQUANT_TBL *qtblptr1)
{
  JDIMENSION blk_x, blk_y;
  int offset_y, k;
  JQUANT_TBL *qtblptr;
  JBLOCKARRAY buffer;
  JBLOCKROW block;
  JCOEFPTR ptr;

  qtblptr = compptr->quant_table;
  for (blk_y = 0; blk_y < compptr->height_in_blocks;
       blk_y += compptr->v_samp_factor) {
    buffer = (*cinfo->mem->access_virt_barray)
      ((j_common_ptr)cinfo, coef_array, blk_y,
       (JDIMENSION)compptr->v_samp_factor, TRUE);
    for (offset_y = 0; offset_y < compptr->v_samp_factor; offset_y++) {
      block = buffer[offset_y];
      for (blk_x = 0; blk_x < compptr->width_in_blocks; blk_x++) {
        ptr = block[blk_x];
        for (k = 0; k < DCTSIZE2; k++)
          if (qtblptr->quantval[k] != qtblptr1->quantval[k])
            ptr[k] *= qtblptr->quantval[k] / qtblptr1->quantval[k];
      }
    }
  }
}